

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synch_test.c
# Opt level: O0

void test_cv_poll(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err num;
  char *pcVar3;
  char *pcVar4;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  notifyarg arg;
  
  memset(&result__1,0,0x20);
  nVar1 = nng_mtx_alloc((nng_mtx **)&arg);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/synch_test.c"
                         ,0xb3,"%s: expected success, got %s (%d)","nng_mtx_alloc(&arg.mx)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_cv_alloc((nng_cv **)&arg.mx,(nng_mtx *)arg._0_8_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/synch_test.c"
                         ,0xb4,"%s: expected success, got %s (%d)","nng_cv_alloc(&arg.cv, arg.mx)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nng_mtx_lock((nng_mtx *)arg._0_8_);
  num = nng_cv_until((nng_cv *)arg.mx,0);
  pcVar3 = nng_strerror(NNG_EAGAIN);
  acutest_check_((uint)(num == NNG_EAGAIN),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/synch_test.c"
                 ,0xb6,"%s fails with %s","nng_cv_until(arg.cv, 0)",pcVar3,nVar1);
  pcVar3 = nng_strerror(NNG_EAGAIN);
  pcVar4 = nng_strerror(num);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_cv_until(arg.cv, 0)",pcVar3,8,pcVar4,
                   (ulong)num);
  nng_mtx_unlock((nng_mtx *)arg._0_8_);
  nng_cv_free((nng_cv *)arg.mx);
  nng_mtx_free((nng_mtx *)arg._0_8_);
  return;
}

Assistant:

static void
test_cv_poll(void)
{
	struct notifyarg arg = { 0 };

	NUTS_PASS(nng_mtx_alloc(&arg.mx));
	NUTS_PASS(nng_cv_alloc(&arg.cv, arg.mx));
	nng_mtx_lock(arg.mx);
	NUTS_FAIL(nng_cv_until(arg.cv, 0), NNG_EAGAIN);
	nng_mtx_unlock(arg.mx);
	nng_cv_free(arg.cv);
	nng_mtx_free(arg.mx);
}